

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<long_double>::InsertSub
          (TPZMatrix<long_double> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          int64_t pRow,int64_t pCol,TPZMatrix<long_double> *pA)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  undefined1 local_48 [24];
  
  lVar1 = pRow + rowSize;
  if ((lVar1 <= (pA->super_TPZBaseMatrix).fRow) &&
     (pCol + colSize <= (pA->super_TPZBaseMatrix).fCol)) {
    if (0 < rowSize) {
      do {
        iVar3 = pCol;
        iVar4 = sCol;
        if (0 < colSize) {
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,sRow,iVar4);
            (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (pA,pRow,iVar3,local_48);
            iVar3 = iVar3 + 1;
            iVar4 = iVar4 + 1;
          } while (iVar3 < pCol + colSize);
        }
        pRow = pRow + 1;
        sRow = sRow + 1;
      } while (pRow < lVar1);
    }
    return 1;
  }
  iVar2 = Error("InsertSub <the sub-matrix is too big that target>",(char *)0x0);
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::InsertSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							   const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
	
	
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        return( Error( "InsertSub <the sub-matrix is too big that target>" ) );
    }
	
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}